

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::Lower(Lowerer *this)

{
  Type *allocator;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  bool defaultDoLoopFastPath;
  bool bVar4;
  AddrOpndKind AVar5;
  int32 iVar6;
  RegSlot RVar7;
  RegSlot RVar8;
  PageAllocator *pageAllocator;
  InstrMap *pIVar9;
  undefined4 *puVar10;
  StackSym *pSVar11;
  SymOpnd *pSVar12;
  IntConstOpnd *pIVar13;
  Instr *pIVar14;
  JITTimeFunctionBody *pJVar15;
  AddrOpnd *this_00;
  long *plVar16;
  long *plVar17;
  Instr *instr_00;
  Instr *instrCall;
  Instr **shrInstr;
  Instr **movInstr;
  Instr **leaInstr;
  AddrOpnd *addrOpnd;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  uint uStack_110;
  IRType opnd1Type;
  int offset;
  uint i;
  uint32 localSlotCount;
  Opnd *opnd2;
  Opnd *opnd1;
  StackSym *sym;
  int32 hasLocalVarChangedOffset;
  bool loopFastPath;
  bool defaultDoFastPath;
  BVSparse<Memory::JitArenaAllocator> localAddToLiveOnBackEdgeSyms;
  undefined1 local_b8 [8];
  BVSparse<Memory::JitArenaAllocator> localInitializedTempSym;
  NoRecoverMemoryJitArenaAllocator localAlloc;
  Lowerer *this_local;
  
  Func::StopMaintainByteCodeOffset(this->m_func);
  pageAllocator =
       Memory::ArenaData::GetPageAllocator
                 (&(this->m_func->m_alloc->super_ArenaAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData);
  allocator = &localInitializedTempSym.lastUsedNodePrevNextField;
  Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)allocator,L"BE-Lower",pageAllocator,
             Js::Throw::OutOfMemory);
  this->m_alloc = (JitArenaAllocator *)allocator;
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)local_b8,(JitArenaAllocator *)allocator);
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)local_b8;
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&hasLocalVarChangedOffset,
             (JitArenaAllocator *)&localInitializedTempSym.lastUsedNodePrevNextField);
  this->addToLiveOnBackEdgeSyms = (BVSparse<Memory::JitArenaAllocator> *)&hasLocalVarChangedOffset;
  pIVar9 = Func::GetCloneMap(this->m_func);
  if (pIVar9 != (InstrMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2a,"(this->m_func->GetCloneMap() == nullptr)",
                       "this->m_func->GetCloneMap() == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  LowererMD::Init(&this->m_lowererMD,this);
  bVar3 = Func::DoFastPaths(this->m_func);
  defaultDoLoopFastPath = Func::DoLoopFastPaths(this->m_func);
  bVar4 = Func::HasAnyStackNestedFunc(this->m_func);
  if (bVar4) {
    EnsureStackFunctionListStackSym(this);
  }
  bVar4 = Func::DoStackFrameDisplay(this->m_func);
  if ((bVar4) && (bVar4 = Func::IsLoopBody(this->m_func), !bVar4)) {
    AllocStackClosure(this);
  }
  AllocStackForInObjectEnumeratorArray(this);
  bVar4 = Func::IsJitInDebugMode(this->m_func);
  if (bVar4) {
    iVar6 = Func::GetHasLocalVarChangedOffset(this->m_func);
    if (iVar6 != -1) {
      pSVar11 = StackSym::New(TyInt8,this->m_func);
      pSVar11->m_offset = iVar6;
      *(uint *)&pSVar11->field_0x18 = *(uint *)&pSVar11->field_0x18 | 0x1000;
      pSVar12 = IR::SymOpnd::New(&pSVar11->super_Sym,TyInt8,this->m_func);
      pIVar13 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      pIVar14 = Func::GetFunctionEntryInsertionPoint(this->m_func);
      InsertMove(&pSVar12->super_Opnd,&pIVar13->super_Opnd,pIVar14,true);
      pJVar15 = Func::GetJITFunctionBody(this->m_func);
      RVar7 = JITTimeFunctionBody::GetEndNonTempLocalIndex(pJVar15);
      pJVar15 = Func::GetJITFunctionBody(this->m_func);
      RVar8 = JITTimeFunctionBody::GetFirstNonTempLocalIndex(pJVar15);
      for (uStack_110 = 0; uStack_110 < RVar7 - RVar8; uStack_110 = uStack_110 + 1) {
        iVar6 = Func::GetLocalVarSlotOffset(this->m_func,uStack_110);
        pIVar13 = IR::IntConstOpnd::New(-0x3131313131313132,TyInt64,this->m_func,false);
        pSVar11 = StackSym::New(TyInt64,this->m_func);
        pSVar11->m_offset = iVar6;
        *(uint *)&pSVar11->field_0x18 = *(uint *)&pSVar11->field_0x18 | 0x1000;
        pSVar12 = IR::SymOpnd::New(&pSVar11->super_Sym,TyInt64,this->m_func);
        pIVar14 = Func::GetFunctionEntryInsertionPoint(this->m_func);
        InsertMove(&pSVar12->super_Opnd,&pIVar13->super_Opnd,pIVar14,true);
      }
    }
    bVar4 = Func::HasAnyStackNestedFunc(this->m_func);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x66,"(!m_func->HasAnyStackNestedFunc())",
                         "!m_func->HasAnyStackNestedFunc()");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
  }
  LowerRange(this,this->m_func->m_headInstr,this->m_func->m_tailInstr,bVar3,defaultDoLoopFastPath);
  if (((DAT_01eca37e & 1) != 0) && ((DAT_01eca37f & 1) != 0)) {
    pIVar14 = this->m_func->m_headInstr;
    while (addrOpnd = (AddrOpnd *)pIVar14, addrOpnd != (AddrOpnd *)0x0) {
      pIVar14 = (Instr *)addrOpnd->m_metadata;
      lVar1._0_2_ = addrOpnd[1].super_Opnd.m_valueType;
      lVar1._2_1_ = addrOpnd[1].super_Opnd.m_type;
      lVar1._3_1_ = addrOpnd[1].super_Opnd.field_0xb;
      lVar1._4_1_ = addrOpnd[1].super_Opnd.m_kind;
      lVar1._5_1_ = addrOpnd[1].super_Opnd.isDeleted;
      lVar1._6_2_ = *(undefined2 *)&addrOpnd[1].super_Opnd.field_0xe;
      if ((lVar1 != 0) &&
         (bVar3 = IR::Opnd::IsAddrOpnd(*(Opnd **)&addrOpnd[1].super_Opnd.m_valueType), bVar3)) {
        this_00 = IR::Opnd::AsAddrOpnd(*(Opnd **)&addrOpnd[1].super_Opnd.m_valueType);
        AVar5 = IR::AddrOpnd::GetAddrOpndKind(this_00);
        if (AVar5 == AddrOpndKindWriteBarrierCardTable) {
          plVar16 = (long *)(*(long *)((long)addrOpnd->m_localAddress + 0x18) + 0x18);
          plVar17 = (long *)((long)addrOpnd->m_localAddress + 0x18);
          if (*(short *)(*plVar16 + 0x30) != 0x42e) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7b,"(leaInstr->m_opcode == Js::OpCode::LEA)",
                               "leaInstr->m_opcode == Js::OpCode::LEA");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          if (*(short *)(*plVar17 + 0x30) != 0x437) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7c,"(movInstr->m_opcode == Js::OpCode::MOV)",
                               "movInstr->m_opcode == Js::OpCode::MOV");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          if (*(short *)((long)addrOpnd->m_localAddress + 0x30) != 0x4a0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7d,"(shrInstr->m_opcode == Js::OpCode::SHR)",
                               "shrInstr->m_opcode == Js::OpCode::SHR");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          LowererMD::LoadHelperArgument
                    (&this->m_lowererMD,(Instr *)*plVar17,*(Opnd **)(*plVar16 + 0x40));
          instr_00 = IR::Instr::New(Call,this->m_func);
          IR::Instr::InsertBefore((Instr *)*plVar17,instr_00);
          LowererMD::ChangeToHelperCall
                    (&this->m_lowererMD,instr_00,HelperWriteBarrierSetVerifyBit,(LabelInstr *)0x0,
                     (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
        }
      }
    }
  }
  Func::ClearCloneMap(this->m_func);
  bVar3 = Func::HasAnyStackNestedFunc(this->m_func);
  if (bVar3) {
    EnsureZeroLastStackFunctionNext(this);
  }
  Func::IsSimpleJit(this->m_func);
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->m_alloc = (JitArenaAllocator *)0x0;
  Func::DisableConstandAddressLoadHoist(this->m_func);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&hasLocalVarChangedOffset);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)local_b8);
  Memory::NoRecoverMemoryJitArenaAllocator::~NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)&localInitializedTempSym.lastUsedNodePrevNextField)
  ;
  return;
}

Assistant:

void
Lowerer::Lower()
{

    this->m_func->StopMaintainByteCodeOffset();

    NoRecoverMemoryJitArenaAllocator localAlloc(_u("BE-Lower"), this->m_func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->m_alloc = &localAlloc;
    BVSparse<JitArenaAllocator> localInitializedTempSym(&localAlloc);
    this->initializedTempSym = &localInitializedTempSym;
    BVSparse<JitArenaAllocator> localAddToLiveOnBackEdgeSyms(&localAlloc);
    this->addToLiveOnBackEdgeSyms = &localAddToLiveOnBackEdgeSyms;
    Assert(this->m_func->GetCloneMap() == nullptr);

    m_lowererMD.Init(this);

    bool defaultDoFastPath = this->m_func->DoFastPaths();
    bool loopFastPath = this->m_func->DoLoopFastPaths();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureStackFunctionListStackSym();
    }
    if (m_func->DoStackFrameDisplay() && !m_func->IsLoopBody())
    {
        AllocStackClosure();
    }

    AllocStackForInObjectEnumeratorArray();

    if (m_func->IsJitInDebugMode())
    {
        // Initialize metadata of local var slots.
        // Too late to wait until Register Allocator, as we need the offset when lowerering bailout for debugger.
        int32 hasLocalVarChangedOffset = m_func->GetHasLocalVarChangedOffset();
        if (hasLocalVarChangedOffset != Js::Constants::InvalidOffset)
        {
            // MOV [EBP + m_func->GetHasLocalVarChangedOffset()], 0
            StackSym* sym = StackSym::New(TyInt8, m_func);
            sym->m_offset = hasLocalVarChangedOffset;
            sym->m_allocated = true;
            IR::Opnd* opnd1 = IR::SymOpnd::New(sym, TyInt8, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func);
            Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());

#ifdef DBG
            // Pre-fill all local slots with a pattern. This will help identify non-initialized/garbage var values.
            // Note that in the beginning of the function in bytecode we should initialize all locals to undefined.
            uint32 localSlotCount = m_func->GetJITFunctionBody()->GetEndNonTempLocalIndex() - m_func->GetJITFunctionBody()->GetFirstNonTempLocalIndex();
            for (uint i = 0; i < localSlotCount; ++i)
            {
                int offset = m_func->GetLocalVarSlotOffset(i);

                IRType opnd1Type;

#if defined(TARGET_32)
                opnd1Type = TyInt32;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern4, opnd1Type, m_func);
#else
                opnd1Type = TyInt64;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern8, opnd1Type, m_func);
#endif

                sym = StackSym::New(opnd1Type, m_func);
                sym->m_offset = offset;
                sym->m_allocated = true;
                opnd1 = IR::SymOpnd::New(sym, opnd1Type, m_func);
                Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());
            }
#endif
        }

        Assert(!m_func->HasAnyStackNestedFunc());
    }

    this->LowerRange(m_func->m_headInstr, m_func->m_tailInstr, defaultDoFastPath, loopFastPath);

#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    // TODO: (leish)(swb) implement for arm
#if defined(_M_IX86) || defined(_M_AMD64)
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        // find out all write barrier setting instr, call Recycler::WBSetBit for verification purpose
        // should do this in LowererMD::GenerateWriteBarrier, however, can't insert call instruction there
        FOREACH_INSTR_EDITING(instr, instrNext, m_func->m_headInstr)
            if (instr->m_src1 && instr->m_src1->IsAddrOpnd())
            {
                IR::AddrOpnd* addrOpnd = instr->m_src1->AsAddrOpnd();
                if (addrOpnd->GetAddrOpndKind() == IR::AddrOpndKindWriteBarrierCardTable)
                {
                    auto& leaInstr = instr->m_prev->m_prev->m_prev;
                    auto& movInstr = instr->m_prev->m_prev;
                    auto& shrInstr = instr->m_prev;
                    Assert(leaInstr->m_opcode == Js::OpCode::LEA);
                    Assert(movInstr->m_opcode == Js::OpCode::MOV);
                    Assert(shrInstr->m_opcode == Js::OpCode::SHR);
                    m_lowererMD.LoadHelperArgument(movInstr, leaInstr->m_dst);
                    IR::Instr* instrCall = IR::Instr::New(Js::OpCode::Call, m_func);
                    movInstr->InsertBefore(instrCall);
                    m_lowererMD.ChangeToHelperCall(instrCall, IR::HelperWriteBarrierSetVerifyBit);
                }
            }
        NEXT_INSTR_EDITING
    }
#endif
#endif

    this->m_func->ClearCloneMap();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureZeroLastStackFunctionNext();
    }

    if (!m_func->IsSimpleJit())
    {
#if 0 // TODO michhol oop jit, reenable assert
        Js::EntryPointInfo* entryPointInfo = this->m_func->m_workItem->GetEntryPoint();
        Assert(entryPointInfo->GetJitTransferData() != nullptr && !entryPointInfo->GetJitTransferData()->GetIsReady());
#endif
    }

    this->initializedTempSym = nullptr;
    this->m_alloc = nullptr;

    this->m_func->DisableConstandAddressLoadHoist();
}